

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

UBool icu_63::DateFormatSymbols::isNumericPatternChar(UChar c,int32_t count)

{
  ulong uVar1;
  UChar *pUVar2;
  bool bVar3;
  
  pUVar2 = u_strchr_63(L"GyMdkHmsSEDFwWahKzYeugAZvcLQqVUOXxrbB",c);
  if (((ulong)(pUVar2 + -0x1d4cb8) & 0x1fffffffe) == 0x4c || pUVar2 == (UChar *)0x0) {
    bVar3 = false;
  }
  else {
    uVar1 = (ulong)(pUVar2 + -0x1d4cb8) >> 1;
    bVar3 = true;
    if ((0x40075bdfaU >> (uVar1 & 0x3f) & 1) == 0) {
      bVar3 = count < 3 && (1L << ((byte)uVar1 & 0x3f) & 0x1e080004U) != 0;
    }
  }
  return bVar3;
}

Assistant:

UBool U_EXPORT2
DateFormatSymbols::isNumericPatternChar(UChar c, int32_t count) {
    return isNumericField(getPatternCharIndex(c), count);
}